

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int mbedtls_aes_xts_setkey_dec(mbedtls_aes_xts_context *ctx,uchar *key,uint keybits)

{
  int iVar1;
  
  if ((keybits == 0x200) || (keybits == 0x100)) {
    iVar1 = mbedtls_aes_setkey_enc(&ctx->tweak,key + (keybits >> 4),keybits >> 1);
    if (iVar1 == 0) {
      iVar1 = mbedtls_aes_setkey_dec(&ctx->crypt,key,keybits >> 1);
      return iVar1;
    }
  }
  else {
    iVar1 = -0x20;
  }
  return iVar1;
}

Assistant:

int mbedtls_aes_xts_setkey_dec( mbedtls_aes_xts_context *ctx,
                                const unsigned char *key,
                                unsigned int keybits)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *key1, *key2;
    unsigned int key1bits, key2bits;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( key != NULL );

    ret = mbedtls_aes_xts_decode_keys( key, keybits, &key1, &key1bits,
                                       &key2, &key2bits );
    if( ret != 0 )
        return( ret );

    /* Set the tweak key. Always set tweak key for encryption. */
    ret = mbedtls_aes_setkey_enc( &ctx->tweak, key2, key2bits );
    if( ret != 0 )
        return( ret );

    /* Set crypt key for decryption. */
    return mbedtls_aes_setkey_dec( &ctx->crypt, key1, key1bits );
}